

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall
pugi::xml_node::insert_copy_before(xml_node *this,xml_node *proto,xml_node *node)

{
  ulong uVar1;
  xml_allocator *this_00;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node xVar4;
  xml_node_struct *pxVar5;
  xml_node_struct **ppxVar6;
  uint uVar7;
  uint uVar8;
  xml_node n;
  xml_node local_28;
  xml_node local_20;
  
  if (proto->_root == (xml_node_struct *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (uint)proto->_root->header & 0xf;
  }
  pxVar5 = this->_root;
  if ((pxVar5 == (xml_node_struct *)0x0) || (uVar8 < 2)) goto LAB_001818f9;
  uVar7 = (uint)pxVar5->header & 0xf;
  if ((uVar7 - 3 < 0xfffffffe) ||
     (((0xfffffffd < uVar8 - 9 && uVar7 != 1 || (node->_root == (xml_node_struct *)0x0)) ||
      (node->_root->parent != pxVar5)))) goto LAB_001818f9;
  this_00 = *(xml_allocator **)((long)pxVar5 - (pxVar5->header >> 8));
  uVar1 = this_00->_busy_size + 0x40;
  if (uVar1 < 0x7fd9) {
    pxVar5 = (xml_node_struct *)
             ((long)&((xml_node_struct *)this_00->_root)->prev_sibling_c + this_00->_busy_size);
    this_00->_busy_size = uVar1;
    xVar4._root = (xml_node_struct *)this_00->_root;
LAB_0018193d:
    pxVar5->prev_sibling_c = (xml_node_struct *)0x0;
    pxVar5->next_sibling = (xml_node_struct *)0x0;
    pxVar5->parent = (xml_node_struct *)0x0;
    pxVar5->first_child = (xml_node_struct *)0x0;
    pxVar5->name = (char_t *)0x0;
    pxVar5->value = (char_t *)0x0;
    pxVar5->first_attribute = (xml_attribute_struct *)0x0;
    pxVar5->header = (ulong)uVar8 | ((long)pxVar5 - (long)xVar4._root) * 0x100;
  }
  else {
    pxVar5 = (xml_node_struct *)
             impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                       (this_00,0x40,(xml_memory_page **)&local_20);
    xVar4._root = local_20._root;
    if (pxVar5 != (xml_node_struct *)0x0) goto LAB_0018193d;
    pxVar5 = (xml_node_struct *)0x0;
  }
  xml_node(&local_20,pxVar5);
  if (local_20._root != (xml_node_struct *)0x0) {
    pxVar5 = node->_root;
    pxVar2 = pxVar5->parent;
    (local_20._root)->parent = pxVar2;
    pxVar3 = pxVar5->prev_sibling_c;
    ppxVar6 = &pxVar2->first_child;
    if (pxVar3->next_sibling != (xml_node_struct *)0x0) {
      ppxVar6 = &pxVar3->next_sibling;
    }
    *ppxVar6 = local_20._root;
    (local_20._root)->prev_sibling_c = pxVar3;
    (local_20._root)->next_sibling = pxVar5;
    pxVar5->prev_sibling_c = local_20._root;
    impl::anon_unknown_0::node_copy_tree(local_20._root,proto->_root);
    return (xml_node)local_20._root;
  }
LAB_001818f9:
  xml_node(&local_28);
  return (xml_node)local_28._root;
}

Assistant:

PUGI__FN xml_node xml_node::insert_copy_before(const xml_node& proto, const xml_node& node)
	{
		xml_node_type type_ = proto.type();
		if (!impl::allow_insert_child(type(), type_)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::insert_node_before(n._root, node._root);
		impl::node_copy_tree(n._root, proto._root);

		return n;
	}